

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void __thiscall
duckdb::
StandardColumnWriter<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
::WriteVectorInternal<false>
          (StandardColumnWriter<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
           *this,WriteStream *temp_writer,ColumnWriterStatistics *stats,
          ColumnWriterPageState *page_state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end
          )

{
  ValidityMask *this_00;
  data_ptr_t pdVar1;
  bool bVar2;
  uint32_t uVar3;
  Allocator *pAVar4;
  InternalException *this_01;
  uint *puVar5;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int64_t extraout_RDX_01;
  int64_t extraout_RDX_02;
  int64_t extraout_RDX_03;
  idx_t r;
  uint64_t *puVar6;
  WriteStream *ser;
  hugeint_t *value;
  ParquetUUIDTargetType target_value_00;
  ParquetUUIDTargetType target_value_01;
  ParquetUUIDTargetType target_value_02;
  ParquetUUIDTargetType target_value_03;
  ParquetUUIDTargetType target_value_04;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t input_02;
  hugeint_t input_03;
  allocator local_59;
  ParquetUUIDTargetType target_value;
  
  ser = (WriteStream *)chunk_start;
  FlatVector::VerifyFlatVector(input_column);
  if (*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState < 10) {
    this_00 = &input_column->validity;
    pdVar1 = input_column->data;
    puVar5 = &switchD_01f1cf0a::switchdataD_0210f478;
    switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
    case 0:
      if ((this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask !=
          (unsigned_long *)0x0) {
        TemplatedWritePlain<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator,false>
                  (input_column,stats,chunk_start,chunk_end,this_00,temp_writer);
        return;
      }
      TemplatedWritePlain<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator,true>
                (input_column,stats,chunk_start,chunk_end,(ValidityMask *)temp_writer,ser);
      return;
    default:
      goto switchD_01f1cf0a_caseD_1;
    case 5:
      if (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0') {
        puVar6 = (uint64_t *)(pdVar1 + chunk_start * 0x10 + 8);
        for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
          bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
          if (bVar2) {
            input_02.upper = extraout_RDX_01;
            input_02.lower = *puVar6;
            target_value = ParquetUUIDOperator::
                           Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                                     ((ParquetUUIDOperator *)puVar6[-1],input_02);
            target_value_03.bytes._0_8_ = target_value.bytes._8_8_;
            target_value_03.bytes._8_8_ = puVar5;
            ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                      ((ParquetUUIDOperator *)stats,target_value.bytes._0_8_,target_value_03);
            DbpEncoder::BeginWrite<duckdb::ParquetUUIDTargetType>
                      ((DbpEncoder *)(page_state_p + 2),temp_writer,&target_value);
            *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
            chunk_start = chunk_start + 1;
            break;
          }
          puVar6 = puVar6 + 2;
        }
      }
      puVar6 = (uint64_t *)(pdVar1 + chunk_start * 0x10 + 8);
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
        if (bVar2) {
          input_03.upper = extraout_RDX_03;
          input_03.lower = *puVar6;
          target_value = ParquetUUIDOperator::
                         Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                                   ((ParquetUUIDOperator *)puVar6[-1],input_03);
          target_value_04.bytes._0_8_ = target_value.bytes._8_8_;
          target_value_04.bytes._8_8_ = puVar5;
          ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                    ((ParquetUUIDOperator *)stats,target_value.bytes._0_8_,target_value_04);
          DbpEncoder::WriteValue<duckdb::ParquetUUIDTargetType>
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,&target_value);
        }
        puVar6 = puVar6 + 2;
      }
      break;
    case 6:
      if (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0') {
        puVar6 = (uint64_t *)(pdVar1 + chunk_start * 0x10 + 8);
        for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
          bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
          if (bVar2) {
            input_00.upper = extraout_RDX_00;
            input_00.lower = *puVar6;
            target_value = ParquetUUIDOperator::
                           Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                                     ((ParquetUUIDOperator *)puVar6[-1],input_00);
            target_value_01.bytes._0_8_ = target_value.bytes._8_8_;
            target_value_01.bytes._8_8_ = &target_value;
            ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                      ((ParquetUUIDOperator *)stats,target_value.bytes._0_8_,target_value_01);
            pAVar4 = BufferAllocator::Get
                               (((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                                context);
            puVar5 = (uint *)&target_value;
            DlbaEncoder::BeginWrite<duckdb::ParquetUUIDTargetType>
                      ((DlbaEncoder *)(page_state_p + 0x909),pAVar4,temp_writer,
                       (ParquetUUIDTargetType *)puVar5);
            *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
            chunk_start = chunk_start + 1;
            break;
          }
          puVar6 = puVar6 + 2;
        }
      }
      puVar6 = (uint64_t *)(pdVar1 + chunk_start * 0x10 + 8);
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
        if (bVar2) {
          input_01.upper = extraout_RDX_02;
          input_01.lower = *puVar6;
          target_value = ParquetUUIDOperator::
                         Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                                   ((ParquetUUIDOperator *)puVar6[-1],input_01);
          target_value_02.bytes._0_8_ = target_value.bytes._8_8_;
          target_value_02.bytes._8_8_ = puVar5;
          ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                    ((ParquetUUIDOperator *)stats,target_value.bytes._0_8_,target_value_02);
          DlbaEncoder::WriteValue<duckdb::ParquetUUIDTargetType>
                    ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,&target_value);
        }
        puVar6 = puVar6 + 2;
      }
      break;
    case 8:
      if (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0') {
        for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
          bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
          if (bVar2) {
            target_value.bytes[0] =
                 *(data_t *)((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4);
            (**temp_writer->_vptr_WriteStream)(temp_writer,&target_value,1);
            page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
            page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
            *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
            break;
          }
        }
      }
      value = (hugeint_t *)(pdVar1 + chunk_start * 0x10);
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
        if (bVar2) {
          uVar3 = PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
                  ::GetIndex((PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
                              *)page_state_p[0x121b]._vptr_ColumnWriterPageState,value);
          target_value.bytes[0] = (char)uVar3;
          target_value.bytes[1] = (char)(uVar3 >> 8);
          target_value.bytes[2] = (char)(uVar3 >> 0x10);
          target_value.bytes[3] = (char)(uVar3 >> 0x18);
          RleBpEncoder::WriteValue
                    ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)&target_value);
        }
        value = value + 1;
      }
      break;
    case 9:
      if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
        pAVar4 = BufferAllocator::Get
                           (((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->context
                           );
        BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar4);
        *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
      }
      puVar6 = (uint64_t *)(pdVar1 + chunk_start * 0x10 + 8);
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
        if (bVar2) {
          input.upper = extraout_RDX;
          input.lower = *puVar6;
          target_value = ParquetUUIDOperator::
                         Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                                   ((ParquetUUIDOperator *)puVar6[-1],input);
          target_value_00.bytes._0_8_ = target_value.bytes._8_8_;
          target_value_00.bytes._8_8_ = puVar5;
          ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                    ((ParquetUUIDOperator *)stats,target_value.bytes._0_8_,target_value_00);
          BssEncoder::WriteValue<duckdb::ParquetUUIDTargetType>
                    ((BssEncoder *)(page_state_p + 0x1215),&target_value);
        }
        puVar6 = puVar6 + 2;
      }
    }
    return;
  }
switchD_01f1cf0a_caseD_1:
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&target_value,"Unknown encoding",&local_59);
  InternalException::InternalException(this_01,(string *)&target_value);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}